

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::verify
          (TextureGatherCubeCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  uint uVar1;
  ConstPixelBufferAccess *pCVar2;
  bool bVar3;
  long lVar4;
  undefined7 extraout_var;
  undefined1 auVar5 [16];
  Vec3 texCoords [4];
  ConstPixelBufferAccess *levels [6];
  undefined1 local_f8 [8];
  undefined1 auStack_f0 [16];
  float afStack_e0 [2];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  ConstPixelBufferAccess *apCStack_c0 [6];
  TextureCubeView local_90;
  ConstPixelBufferAccess *local_58 [7];
  
  local_d8._0_4_ = 0.0;
  local_d8._4_4_ = 0.0;
  local_d8._8_4_ = 0.0;
  local_d8._12_4_ = 0.0;
  auStack_f0._8_4_ = 0.0;
  auStack_f0._12_4_ = 0.0;
  afStack_e0[0] = 0.0;
  afStack_e0[1] = 0.0;
  local_f8._0_4_ = 0.0;
  local_f8._4_4_ = 0.0;
  auStack_f0._0_4_ = 0.0;
  auStack_f0._4_4_ = 0.0;
  (*(this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
            (&local_90,this,(ulong)ctx & 0xffffffff);
  lVar4 = 0;
  do {
    *(undefined4 *)(auStack_f0 + lVar4) = *(undefined4 *)(local_90._0_8_ + lVar4 + 8);
    *(undefined8 *)(local_f8 + lVar4) = *(undefined8 *)(local_90._0_8_ + lVar4);
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x30);
  operator_delete((void *)local_90._0_8_,(long)local_90.m_levels[1] - local_90._0_8_);
  apCStack_c0[5] = (this->m_swizzledTexture).m_view.m_levels[5];
  local_c8 = *(undefined8 *)&(this->m_swizzledTexture).m_view;
  apCStack_c0[3] = (this->m_swizzledTexture).m_view.m_levels[3];
  apCStack_c0[4] = (this->m_swizzledTexture).m_view.m_levels[4];
  apCStack_c0[1] = (this->m_swizzledTexture).m_view.m_levels[1];
  apCStack_c0[2] = (this->m_swizzledTexture).m_view.m_levels[2];
  apCStack_c0[0] = (this->m_swizzledTexture).m_view.m_levels[0];
  uVar1 = (this->super_TextureGatherCase).m_baseLevel;
  lVar4 = 1;
  auVar5._0_8_ = (long)(int)uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = (int)uVar1 >> 0x1f;
  do {
    pCVar2 = apCStack_c0[lVar4];
    local_58[lVar4 + -1] =
         (ConstPixelBufferAccess *)
         ((long)apCStack_c0[lVar4 + -1][uVar1].m_size.m_data +
         ((ulong)(uint)((int)uVar1 >> 0x1f) * 0x28 << 0x20) + -8);
    local_58[lVar4] =
         (ConstPixelBufferAccess *)
         ((long)pCVar2[auVar5._8_8_ & 0xffffffff].m_size.m_data +
         ((auVar5._8_8_ >> 0x20) * 0x28 << 0x20) + -8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 7);
  tcu::TextureCubeView::TextureCubeView(&local_90,1,(ConstPixelBufferAccess *(*) [6])local_58);
  bVar3 = (anonymous_namespace)::TextureGatherCase::
          verify<tcu::TextureCubeView,tcu::Vector<float,3>>
                    ((TextureGatherCase *)this,(ConstPixelBufferAccess *)sig,&local_90,
                     (Vector<float,_3> (*) [4])local_f8,
                     &(this->m_iterations).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)ctx].gatherArgs);
  return (int)CONCAT71(extraout_var,bVar3);
}

Assistant:

bool TextureGatherCubeCase::verify (int iterationNdx, const ConstPixelBufferAccess& rendered) const
{
	Vec3 texCoords[4];
	computeTexCoordVecs(computeQuadTexCoord(iterationNdx), texCoords);
	return TextureGatherCase::verify(rendered, getOneLevelSubView(tcu::TextureCubeView(m_swizzledTexture), m_baseLevel), texCoords, m_iterations[iterationNdx].gatherArgs);
}